

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.h
# Opt level: O2

HanabiCard __thiscall
hanabi_learning_env::HanabiState::HanabiDeck::DealCard(HanabiDeck *this,int color,int rank)

{
  int iVar1;
  pointer piVar2;
  HanabiCard HVar3;
  int iVar4;
  
  iVar4 = color * this->num_ranks_ + rank;
  piVar2 = (this->card_count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar2[iVar4];
  if (0 < iVar1) {
    piVar2[iVar4] = iVar1 + -1;
    this->total_count_ = this->total_count_ + -1;
    return (HanabiCard)
           ((long)iVar4 / (long)this->num_ranks_ & 0xffffffffU |
           (long)iVar4 % (long)this->num_ranks_ << 0x20);
  }
  HVar3.color_ = -1;
  HVar3.rank_ = -1;
  return HVar3;
}

Assistant:

int CardToIndex(int color, int rank) const {
      return color * num_ranks_ + rank;
    }